

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * __thiscall ABS::forward(ABS *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  double dVar1;
  tensor *ptVar2;
  tensor *ptVar3;
  undefined4 uVar4;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar3 = (tensor *)operator_new(0x20);
  ptVar3->data = 0.0;
  ptVar3->grad = 0.0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  ptVar3->cnt = 0;
  ptVar3->cnt_free = 0;
  ptVar3->hook = (node *)0x0;
  (this->super_node).ret = ptVar3;
  ptVar2 = *(this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  dVar1 = ptVar2->data;
  uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
  if (dVar1 <= -dVar1) {
    uVar4 = (undefined4)((ulong)-dVar1 >> 0x20);
  }
  ptVar3->data = (double)CONCAT44(uVar4,SUB84(dVar1,0));
  *(this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
   super__Vector_impl_data._M_start = *(double *)(&DAT_00107030 + (ulong)(0.0 < ptVar2->data) * 8);
  ptVar2->cnt = ptVar2->cnt + 1;
  ptVar2->cnt_free = ptVar2->cnt_free + 1;
  ptVar3->hook = &this->super_node;
  return ptVar3;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data>0 ? input[0]->data:-input[0]->data;
        grad_fn[0]=input[0]->data>0 ? 1:-1;
        input[0]->cnt++;
        input[0]->cnt_free++;
        ret->hook=this;
        return ret;
    }